

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O1

string * __thiscall
pbrt::TextureSceneEntity::ToString_abi_cxx11_
          (string *__return_storage_ptr__,TextureSceneEntity *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<std::__cxx11::string_const&,pbrt::ParameterDictionary_const&,pbrt::FileLoc_const&,pbrt::AnimatedTransform_const&,std::__cxx11::string_const&>
            (__return_storage_ptr__,
             "[ TextureSeneEntity name: %s parameters: %s loc: %s renderFromObject: %s texName: %s ]"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             &(this->super_TransformedSceneEntity).super_SceneEntity.parameters,
             &(this->super_TransformedSceneEntity).super_SceneEntity.loc,
             &(this->super_TransformedSceneEntity).renderFromObject,&this->texName);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ TextureSeneEntity name: %s parameters: %s loc: %s "
                            "renderFromObject: %s texName: %s ]",
                            name, parameters, loc, renderFromObject, texName);
    }